

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cell.cpp
# Opt level: O0

unique_ptr<Cell,_std::default_delete<Cell>_> __thiscall
CellGenerator::operator()(CellGenerator *this)

{
  runtime_error *this_00;
  undefined4 *in_RSI;
  unique_ptr<NonWrappingCell,_std::default_delete<NonWrappingCell>_> local_38 [3];
  char local_19;
  uint8_t ver;
  CellGenerator *this_local;
  
  local_19 = ((byte)*in_RSI & 2) + ((byte)*in_RSI & 1) * '\x02';
  this_local = this;
  switch(local_19) {
  case '\0':
    std::make_unique<Cell>();
    break;
  case '\x02':
    std::make_unique<NonWrappingCell>();
    std::unique_ptr<Cell,std::default_delete<Cell>>::
    unique_ptr<NonWrappingCell,std::default_delete<NonWrappingCell>,void>
              ((unique_ptr<Cell,std::default_delete<Cell>> *)this,local_38);
    std::unique_ptr<NonWrappingCell,_std::default_delete<NonWrappingCell>_>::~unique_ptr(local_38);
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Runtime Error: Unknown cell type.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (__uniq_ptr_data<Cell,_std::default_delete<Cell>,_true,_true>)
         (__uniq_ptr_data<Cell,_std::default_delete<Cell>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Cell> CellGenerator::operator()() const {
    using namespace wtlgo::bf;
    uint8_t ver = (opt & NON_WRAPPING_CELLS) * 2 + (opt & SIGNED_CELLS);
    switch (ver) {
        case true  * 2 + true : return std::make_unique<NonWrappingSignedCell>();
        case false * 2 + true : return std::make_unique<SignedCell>();
        case true  * 2 + false: return std::make_unique<NonWrappingCell>();
        case false * 2 + false: return std::make_unique<Cell>();

        default: throw std::runtime_error("Runtime Error: Unknown cell type.");
    }

    return nullptr;
}